

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.c
# Opt level: O2

void abuf_template_init_ext
               (abuf_template_storage *storage,abuf_template_data *data,size_t data_count,
               char *format)

{
  char cVar1;
  abuf_template_data_entry *paVar2;
  char *__s1;
  byte bVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  size_t local_90;
  
  memset(storage,0,0x610);
  if (format == (char *)0x0) {
    storage->format = "\t";
    sVar5 = 0;
    for (sVar6 = 0; sVar6 != data_count; sVar6 = sVar6 + 1) {
      lVar8 = 0;
      for (uVar7 = 0; uVar7 < data[sVar6].count; uVar7 = uVar7 + 1) {
        storage->indices[sVar5].start = 1;
        sVar5 = storage->count;
        storage->indices[sVar5].end = 0;
        storage->indices[sVar5].data =
             (abuf_template_data_entry *)((long)&(data[sVar6].data)->key + lVar8);
        sVar5 = sVar5 + 1;
        storage->count = sVar5;
        lVar8 = lVar8 + 0x18;
      }
    }
    if (sVar5 != 0) {
      storage->indices[0].start = 0;
      storage->indices[sVar5 - 1].end = 1;
    }
    return;
  }
  storage->format = format;
  bVar10 = true;
  local_90 = 0;
  bVar3 = 0;
  uVar7 = 0;
  uVar9 = 0;
  do {
    while( true ) {
      cVar1 = format[uVar9];
      if (cVar1 == '\0') {
        return;
      }
      if (!(bool)(cVar1 != '%' | bVar3)) break;
      bVar3 = (bVar3 ^ 1) & cVar1 == '\\';
LAB_00144dfb:
      uVar9 = uVar9 + 1;
    }
    if (!bVar10) {
      if (1 < uVar9 - uVar7) {
        for (sVar5 = 0; sVar5 != data_count; sVar5 = sVar5 + 1) {
          sVar6 = data[sVar5].count;
          lVar8 = 0;
          while (bVar10 = sVar6 != 0, sVar6 = sVar6 - 1, bVar10) {
            paVar2 = data[sVar5].data;
            __s1 = *(char **)((long)&paVar2->key + lVar8);
            iVar4 = strncmp(__s1,format + uVar7 + 1,~uVar7 + uVar9);
            if ((iVar4 == 0) && (__s1[(uVar9 - 1) - uVar7] == '\0')) {
              storage->indices[local_90].start = uVar7;
              local_90 = storage->count;
              storage->indices[local_90].end = uVar9 + 1;
              storage->indices[local_90].data =
                   (abuf_template_data_entry *)((long)&paVar2->key + lVar8);
              local_90 = local_90 + 1;
              storage->count = local_90;
              bVar3 = 0;
              bVar10 = true;
              goto LAB_00144dfb;
            }
            lVar8 = lVar8 + 0x18;
          }
        }
      }
      bVar10 = true;
      bVar3 = 0;
      goto LAB_00144dfb;
    }
    bVar10 = false;
    uVar7 = uVar9;
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

void
abuf_template_init_ext(
  struct abuf_template_storage *storage, struct abuf_template_data *data, size_t data_count, const char *format) {
  /* helper string for 'just one tab between keys' */
  static const char default_format[] = "\t";

  struct abuf_template_data_entry *d;
  bool no_open_format = true;
  bool escape = false;
  size_t start = 0;
  size_t pos = 0;
  size_t i, j;

  memset(storage, 0, sizeof(*storage));

  if (!format) {
    /* generate default format, just tab between each value */
    storage->format = default_format;

    storage->count = 0;

    for (j = 0; j < data_count; j++) {
      for (i = 0; i < data[j].count; i++) {
        storage->indices[storage->count].start = 1;
        storage->indices[storage->count].end = 0;
        storage->indices[storage->count].data = &data[j].data[i];
        storage->count++;
      }
    }

    if (storage->count) {
      storage->indices[0].start = 0;
      storage->indices[storage->count - 1].end = 1;
    }
    return;
  }

  storage->format = format;
  while (format[pos]) {
    if (!escape && format[pos] == '%') {
      if (no_open_format) {
        start = pos++;
        no_open_format = false;
        continue;
      }
      if (pos - start > 1) {
        d = _find_template(data, data_count, &format[start + 1], pos - start - 1);
        if (d) {
          storage->indices[storage->count].start = start;
          storage->indices[storage->count].end = pos + 1;
          storage->indices[storage->count].data = d;

          storage->count++;
        }
      }
      no_open_format = true;
    }
    else if (format[pos] == '\\') {
      /* handle "\\" and "\%" in text */
      escape = !escape;
    }
    else {
      escape = false;
    }

    pos++;
  }
}